

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O1

int __thiscall
vkt::shaderexecutor::ShaderPackingFunctionTests::init
          (ShaderPackingFunctionTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  PackSnorm4x8Case *this_00;
  TestNode *pTVar1;
  PackUnorm4x8Case *this_01;
  PackSnorm2x16Case *this_02;
  PackUnorm2x16Case *this_03;
  int prec;
  Precision PVar2;
  long lVar3;
  
  PVar2 = PRECISION_MEDIUMP;
  do {
    lVar3 = 0;
    do {
      this_00 = (PackSnorm4x8Case *)operator_new(0xf0);
      PackSnorm4x8Case::PackSnorm4x8Case
                (this_00,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                 *(ShaderType *)((long)&DAT_00b596f0 + lVar3),PVar2);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x18);
    PVar2 = PVar2 + PRECISION_MEDIUMP;
  } while (PVar2 != PRECISION_LAST);
  lVar3 = 0;
  do {
    pTVar1 = (TestNode *)operator_new(0xe8);
    UnpackSnorm4x8Case::UnpackSnorm4x8Case
              ((UnpackSnorm4x8Case *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(ShaderType *)((long)&DAT_00b596f0 + lVar3));
    tcu::TestNode::addChild((TestNode *)this,pTVar1);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x18);
  PVar2 = PRECISION_MEDIUMP;
  do {
    lVar3 = 0;
    do {
      this_01 = (PackUnorm4x8Case *)operator_new(0xf0);
      PackUnorm4x8Case::PackUnorm4x8Case
                (this_01,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                 *(ShaderType *)((long)&DAT_00b596f0 + lVar3),PVar2);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x18);
    PVar2 = PVar2 + PRECISION_MEDIUMP;
  } while (PVar2 != PRECISION_LAST);
  lVar3 = 0;
  do {
    pTVar1 = (TestNode *)operator_new(0xe8);
    UnpackUnorm4x8Case::UnpackUnorm4x8Case
              ((UnpackUnorm4x8Case *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(ShaderType *)((long)&DAT_00b596f0 + lVar3));
    tcu::TestNode::addChild((TestNode *)this,pTVar1);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x18);
  PVar2 = PRECISION_MEDIUMP;
  do {
    lVar3 = 0;
    do {
      this_02 = (PackSnorm2x16Case *)operator_new(0xf0);
      PackSnorm2x16Case::PackSnorm2x16Case
                (this_02,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                 *(ShaderType *)((long)&DAT_00b59770 + lVar3),PVar2);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
      lVar3 = lVar3 + 4;
    } while (lVar3 == 4);
    PVar2 = PVar2 + PRECISION_MEDIUMP;
  } while (PVar2 != PRECISION_LAST);
  lVar3 = 0;
  do {
    pTVar1 = (TestNode *)operator_new(0xe8);
    UnpackSnorm2x16Case::UnpackSnorm2x16Case
              ((UnpackSnorm2x16Case *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(ShaderType *)((long)&DAT_00b59770 + lVar3));
    tcu::TestNode::addChild((TestNode *)this,pTVar1);
    lVar3 = lVar3 + 4;
  } while (lVar3 == 4);
  PVar2 = PRECISION_MEDIUMP;
  do {
    lVar3 = 0;
    do {
      this_03 = (PackUnorm2x16Case *)operator_new(0xf0);
      PackUnorm2x16Case::PackUnorm2x16Case
                (this_03,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                 *(ShaderType *)((long)&DAT_00b59770 + lVar3),PVar2);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
      lVar3 = lVar3 + 4;
    } while (lVar3 == 4);
    PVar2 = PVar2 + PRECISION_MEDIUMP;
  } while (PVar2 != PRECISION_LAST);
  lVar3 = 0;
  do {
    pTVar1 = (TestNode *)operator_new(0xe8);
    UnpackUnorm2x16Case::UnpackUnorm2x16Case
              ((UnpackUnorm2x16Case *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(ShaderType *)((long)&DAT_00b59770 + lVar3));
    tcu::TestNode::addChild((TestNode *)this,pTVar1);
    lVar3 = lVar3 + 4;
  } while (lVar3 == 4);
  lVar3 = 0;
  do {
    pTVar1 = (TestNode *)operator_new(0xe8);
    PackHalf2x16Case::PackHalf2x16Case
              ((PackHalf2x16Case *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(ShaderType *)((long)&DAT_00b59770 + lVar3));
    tcu::TestNode::addChild((TestNode *)this,pTVar1);
    lVar3 = lVar3 + 4;
  } while (lVar3 == 4);
  lVar3 = 0;
  do {
    pTVar1 = (TestNode *)operator_new(0xe8);
    UnpackHalf2x16Case::UnpackHalf2x16Case
              ((UnpackHalf2x16Case *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               *(ShaderType *)((long)&DAT_00b59770 + lVar3));
    tcu::TestNode::addChild((TestNode *)this,pTVar1);
    lVar3 = lVar3 + 4;
  } while (lVar3 == 4);
  return extraout_EAX;
}

Assistant:

void ShaderPackingFunctionTests::init (void)
{
	// New built-in functions in GLES 3.1
	{
		const glu::ShaderType allShaderTypes[] =
		{
			glu::SHADERTYPE_VERTEX,
			glu::SHADERTYPE_TESSELLATION_CONTROL,
			glu::SHADERTYPE_TESSELLATION_EVALUATION,
			glu::SHADERTYPE_GEOMETRY,
			glu::SHADERTYPE_FRAGMENT,
			glu::SHADERTYPE_COMPUTE
		};

		// packSnorm4x8
		for (int prec = glu::PRECISION_MEDIUMP; prec < glu::PRECISION_LAST; prec++)
		{
			for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(allShaderTypes); shaderTypeNdx++)
				addChild(new PackSnorm4x8Case(m_testCtx, allShaderTypes[shaderTypeNdx], glu::Precision(prec)));
		}

		// unpackSnorm4x8
		for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(allShaderTypes); shaderTypeNdx++)
			addChild(new UnpackSnorm4x8Case(m_testCtx, allShaderTypes[shaderTypeNdx]));

		// packUnorm4x8
		for (int prec = glu::PRECISION_MEDIUMP; prec < glu::PRECISION_LAST; prec++)
		{
			for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(allShaderTypes); shaderTypeNdx++)
				addChild(new PackUnorm4x8Case(m_testCtx, allShaderTypes[shaderTypeNdx], glu::Precision(prec)));
		}

		// unpackUnorm4x8
		for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(allShaderTypes); shaderTypeNdx++)
			addChild(new UnpackUnorm4x8Case(m_testCtx, allShaderTypes[shaderTypeNdx]));
	}

	// GLES 3 functions in new shader types.
	{
		const glu::ShaderType newShaderTypes[] =
		{
			glu::SHADERTYPE_GEOMETRY,
			glu::SHADERTYPE_COMPUTE
		};

		// packSnorm2x16
		for (int prec = glu::PRECISION_MEDIUMP; prec < glu::PRECISION_LAST; prec++)
		{
			for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(newShaderTypes); shaderTypeNdx++)
				addChild(new PackSnorm2x16Case(m_testCtx, newShaderTypes[shaderTypeNdx], glu::Precision(prec)));
		}

		// unpackSnorm2x16
		for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(newShaderTypes); shaderTypeNdx++)
			addChild(new UnpackSnorm2x16Case(m_testCtx, newShaderTypes[shaderTypeNdx]));

		// packUnorm2x16
		for (int prec = glu::PRECISION_MEDIUMP; prec < glu::PRECISION_LAST; prec++)
		{
			for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(newShaderTypes); shaderTypeNdx++)
				addChild(new PackUnorm2x16Case(m_testCtx, newShaderTypes[shaderTypeNdx], glu::Precision(prec)));
		}

		// unpackUnorm2x16
		for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(newShaderTypes); shaderTypeNdx++)
			addChild(new UnpackUnorm2x16Case(m_testCtx, newShaderTypes[shaderTypeNdx]));

		// packHalf2x16
		for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(newShaderTypes); shaderTypeNdx++)
			addChild(new PackHalf2x16Case(m_testCtx, newShaderTypes[shaderTypeNdx]));

		// unpackHalf2x16
		for (int shaderTypeNdx = 0; shaderTypeNdx < DE_LENGTH_OF_ARRAY(newShaderTypes); shaderTypeNdx++)
			addChild(new UnpackHalf2x16Case(m_testCtx, newShaderTypes[shaderTypeNdx]));
	}
}